

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

void inmateMove(UnitList *inmateList,Path *path)

{
  float fVar1;
  UnitNode *pUVar2;
  uint local_30;
  int i;
  int prevPos;
  TileNode *nextTile;
  UnitNode *nextInmate;
  Path *path_local;
  UnitList *inmateList_local;
  
  nextTile = (TileNode *)getHead(inmateList);
  do {
    _i = path->first;
    local_30 = 0;
    for (; (local_30 < path->count && (_i->location != (int)*(float *)(*(long *)nextTile + 4)));
        _i = _i->next) {
      local_30 = local_30 + 1;
    }
    fVar1 = *(float *)(*(long *)nextTile + 4);
    *(float *)(*(long *)nextTile + 4) =
         *(float *)(*(long *)nextTile + 4) + (float)*(uint *)(*(long *)nextTile + 0x10) / 8.0;
    if (((int)*(float *)(*(long *)nextTile + 4) == (int)fVar1 + 1) && (_i->next != (TileNode *)0x0))
    {
      *(float *)(*(long *)nextTile + 4) = (float)_i->next->location;
    }
    else if (((int)*(float *)(*(long *)nextTile + 4) == (int)fVar1 + 1) &&
            (_i->next == (TileNode *)0x0)) {
      **(undefined1 **)nextTile = 1;
    }
    nextTile = (TileNode *)getNext((UnitNode *)nextTile);
    pUVar2 = getNext((UnitNode *)nextTile);
  } while (pUVar2 != (UnitNode *)0x0);
  return;
}

Assistant:

void inmateMove(struct UnitList *inmateList, struct Path *path) {
    struct UnitNode *nextInmate;
    struct TileNode *nextTile;
    int prevPos;

    nextInmate = getHead(inmateList);
    do {
        nextTile = path->first;
        for (int i = 0; i < path->count; i++) {
            if (nextTile->location ==
                (int) ((struct Inmate *) nextInmate->unit)->position)
                break;
            nextTile = nextTile->next;
        }
        prevPos = ((struct Inmate *) nextInmate->unit)->position;
        ((struct Inmate *) nextInmate->unit)->position =
            ((struct Inmate *) nextInmate->unit)->position +
                (float) ((struct Inmate *) nextInmate->unit)->speed / 8;
        if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next != NULL)
            ((struct Inmate *) nextInmate->unit)->position = nextTile->next->location;
        else if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next == NULL) {
            ((struct Inmate *) nextInmate->unit)->delUnit = TRUE;
            //endwin();
        }
        nextInmate = getNext(nextInmate);
    } while (getNext(nextInmate));
}